

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DisableForkStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DisableForkStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          Token *args_4)

{
  Token disable;
  Token semi;
  DisableForkStatementSyntax *label;
  Token *in_RCX;
  Info *in_R8;
  undefined8 *in_R9;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  label = (DisableForkStatementSyntax *)
          allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  disable.info = (Info *)in_R8->rawTextPtr;
  disable._0_8_ = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_R9[1];
  semi.info = in_R8;
  semi._0_8_ = in_R9;
  slang::syntax::DisableForkStatementSyntax::DisableForkStatementSyntax
            ((DisableForkStatementSyntax *)*in_R9,(NamedLabelSyntax *)label,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_R9[1],disable,*in_RCX,semi);
  return label;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }